

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void pugi::impl::anon_unknown_0::text_output
               (xml_buffered_writer *writer,char_t *s,chartypex_t type,uint flags)

{
  byte bVar1;
  byte *pbVar2;
  size_t sVar3;
  size_t length;
  void *pvVar4;
  ulong uVar5;
  int __fd;
  byte *pbVar6;
  
  if ((flags & 0x10) != 0) {
    xml_buffered_writer::write_string(writer,s);
    return;
  }
  bVar1 = *s;
  do {
    if (bVar1 == 0) {
      return;
    }
    pbVar2 = (byte *)s + 1;
    do {
      pbVar6 = pbVar2;
      if (((byte)(anonymous_namespace)::chartypex_table[pbVar6[-1]] & type) != 0) {
        pbVar6 = pbVar6 + -1;
        goto LAB_0016242c;
      }
      if (((byte)(anonymous_namespace)::chartypex_table[*pbVar6] & type) != 0) goto LAB_0016242c;
      if (((byte)(anonymous_namespace)::chartypex_table[pbVar6[1]] & type) != 0) {
        pbVar6 = pbVar6 + 1;
        goto LAB_0016242c;
      }
      pbVar2 = pbVar6 + 4;
    } while (((byte)(anonymous_namespace)::chartypex_table[pbVar6[2]] & type) == 0);
    pbVar6 = pbVar6 + 2;
LAB_0016242c:
    length = (long)pbVar6 - (long)s;
    uVar5 = length + writer->bufsize;
    if (uVar5 < 0x801) {
      memcpy(writer->buffer + writer->bufsize,s,length);
      writer->bufsize = uVar5;
    }
    else {
      xml_buffered_writer::write_direct(writer,s,length);
    }
    bVar1 = *pbVar6;
    if (bVar1 < 0x27) {
      if (bVar1 == 0x22) {
        if ((flags >> 9 & 1) != 0) {
          uVar5 = writer->bufsize;
          if (0x7ff < uVar5) {
            xml_buffered_writer::flush(writer,writer->buffer,uVar5);
            uVar5 = 0;
          }
          writer->buffer[uVar5] = '\"';
          goto LAB_001625af;
        }
        __fd = 0x71;
        pvVar4 = (void *)0x75;
        sVar3 = 0x74;
LAB_00162586:
        xml_buffered_writer::write(writer,__fd,pvVar4,sVar3);
      }
      else {
        if (bVar1 == 0x26) {
          pvVar4 = (void *)0x61;
          sVar3 = 0x6d;
        }
        else {
          if (bVar1 == 0) {
            return;
          }
LAB_0016252b:
          if ((flags >> 8 & 1) != 0) goto LAB_001625b9;
          sVar3 = (size_t)(uint)(int)(char)((char)((uint)(int)(char)bVar1 / 10) + '0');
          pvVar4 = (void *)0x23;
        }
        xml_buffered_writer::write(writer,0x26,pvVar4,sVar3);
      }
    }
    else if (bVar1 == 0x27) {
      if ((flags >> 9 & 1) != 0) {
        __fd = 0x61;
        pvVar4 = (void *)0x70;
        sVar3 = 0x73;
        goto LAB_00162586;
      }
      uVar5 = writer->bufsize;
      if (0x7ff < uVar5) {
        xml_buffered_writer::flush(writer,writer->buffer,uVar5);
        uVar5 = 0;
      }
      writer->buffer[uVar5] = '\'';
LAB_001625af:
      writer->bufsize = uVar5 + 1;
    }
    else {
      if (bVar1 == 0x3c) {
        pvVar4 = (void *)0x6c;
      }
      else {
        if (bVar1 != 0x3e) goto LAB_0016252b;
        pvVar4 = (void *)0x67;
      }
      xml_buffered_writer::write(writer,0x26,pvVar4,0x74);
    }
LAB_001625b9:
    s = (char_t *)(pbVar6 + 1);
    bVar1 = pbVar6[1];
  } while( true );
}

Assistant:

PUGI_IMPL_FN void text_output(xml_buffered_writer& writer, const char_t* s, chartypex_t type, unsigned int flags)
	{
		if (flags & format_no_escapes)
			writer.write_string(s);
		else
			text_output_escaped(writer, s, type, flags);
	}